

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_queue.h
# Opt level: O0

bool __thiscall
buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
          (buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item)

{
  undefined1 local_30 [8];
  unique_lock<std::mutex> lck;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item_local;
  buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  lck._8_8_ = item;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_30,&this->b_mutex);
  if (this->b_size < this->capacity) {
    this->b_last = (this->b_last + 1) % this->capacity;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this->b_array + this->b_last,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lck._8_8_);
    this->b_size = this->b_size + 1;
    if ((this->b_debug & 1U) != 0) {
      this->b_wcnt = this->b_wcnt + 1;
    }
    std::condition_variable::notify_all();
    this_local._7_1_ = true;
  }
  else {
    std::condition_variable::notify_all();
    this_local._7_1_ = false;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  return this_local._7_1_;
}

Assistant:

bool push(const T &item)
    {
        unique_lock<mutex> lck (b_mutex);;
        if (b_size >= capacity)
        {
            b_cond.notify_all();            
            return false;
        }

        b_last = (b_last + 1) % capacity;
        b_array[b_last] = item;

        b_size++;
        if(b_debug)
        {
            b_wcnt++;
        }
        b_cond.notify_all();
        
        return true;
    }